

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O1

size_t tinyusdz::LZ4Compression::DecompressFromBuffer
                 (char *compressedPtr,char *outputPtr,size_t compressedSize,size_t maxOutputSize,
                 string *err)

{
  char cVar1;
  int compressedSize_00;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  long *plVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  int *source;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  string __str;
  size_t local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ulong local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (compressedSize < 2) {
    if (err != (string *)0x0) {
      pcVar11 = (char *)err->_M_string_length;
      pcVar9 = "Invalid compressedSize.\n";
LAB_00317aa6:
      ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar11,(ulong)pcVar9);
      return 0;
    }
  }
  else {
    cVar1 = *compressedPtr;
    if (cVar1 == '\0' || 0x7dffffff < maxOutputSize) {
      source = (int *)(compressedPtr + 1);
      if (cVar1 == '\0') {
        uVar5 = LZ4_decompress_safe((char *)source,outputPtr,(int)compressedSize + -1,
                                    (int)maxOutputSize);
        if (-1 < (int)uVar5) {
          return (ulong)uVar5;
        }
        if (err != (string *)0x0) {
          uVar5 = -uVar5;
          uVar14 = 1;
          if (9 < uVar5) {
            uVar13 = uVar5;
            uVar4 = 4;
            do {
              uVar14 = uVar4;
              if (uVar13 < 100) {
                uVar14 = uVar14 - 2;
                goto LAB_00317e65;
              }
              if (uVar13 < 1000) {
                uVar14 = uVar14 - 1;
                goto LAB_00317e65;
              }
              if (uVar13 < 10000) goto LAB_00317e65;
              bVar2 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              uVar4 = uVar14 + 4;
            } while (bVar2);
            uVar14 = uVar14 + 1;
          }
LAB_00317e65:
          local_50[0] = local_40;
          ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar14 + '\x01');
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_50[0] + 1),uVar14,uVar5);
          plVar8 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3c79f8);
          plVar7 = plVar8 + 2;
          if ((long *)*plVar8 == plVar7) {
            local_90 = *plVar7;
            lStack_88 = plVar8[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar7;
            local_a0 = (long *)*plVar8;
          }
          local_98 = plVar8[1];
          *plVar8 = (long)plVar7;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)::std::__cxx11::string::append((char *)&local_a0);
          plVar7 = plVar8 + 2;
          if ((long *)*plVar8 == plVar7) {
            local_70 = *plVar7;
            lStack_68 = plVar8[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar7;
            local_80 = (long *)*plVar8;
          }
          local_78 = plVar8[1];
          *plVar8 = (long)plVar7;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_80);
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90 + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
      }
      else if ('\0' < cVar1) {
        iVar12 = 0;
        local_c0 = 0;
        uVar10 = 1;
        local_60 = maxOutputSize;
        local_58 = outputPtr;
        do {
          uVar3 = local_60;
          uVar15 = uVar10 + 4;
          if (compressedSize < uVar15) {
joined_r0x00317b25:
            if (err != (string *)0x0) {
              ::std::__cxx11::string::append((char *)err);
            }
            bVar2 = false;
            uVar15 = uVar10;
          }
          else {
            compressedSize_00 = *source;
            if ((0x7e000000 < (long)compressedSize_00) || (compressedSize_00 < 1))
            goto joined_r0x00317b25;
            source = source + 1;
            uVar10 = 0x7e000000;
            if (local_60 < 0x7e000000) {
              uVar10 = local_60;
            }
            uVar5 = LZ4_decompress_safe((char *)source,local_58,compressedSize_00,(int)uVar10);
            if ((int)uVar5 < 1) {
              if (err == (string *)0x0) {
                bVar2 = false;
              }
              else {
                uVar14 = -uVar5;
                if (0 < (int)uVar5) {
                  uVar14 = uVar5;
                }
                uVar13 = 1;
                if (9 < uVar14) {
                  uVar10 = (ulong)uVar14;
                  uVar4 = 4;
                  do {
                    uVar13 = uVar4;
                    uVar6 = (uint)uVar10;
                    if (uVar6 < 100) {
                      uVar13 = uVar13 - 2;
                      goto LAB_00317c88;
                    }
                    if (uVar6 < 1000) {
                      uVar13 = uVar13 - 1;
                      goto LAB_00317c88;
                    }
                    if (uVar6 < 10000) goto LAB_00317c88;
                    uVar10 = uVar10 / 10000;
                    uVar4 = uVar13 + 4;
                  } while (99999 < uVar6);
                  uVar13 = uVar13 + 1;
                }
LAB_00317c88:
                local_50[0] = local_40;
                ::std::__cxx11::string::_M_construct
                          ((ulong)local_50,(char)uVar13 - (char)((int)uVar5 >> 0x1f));
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_50[0]),uVar13,uVar14);
                plVar7 = (long *)::std::__cxx11::string::replace
                                           ((ulong)local_50,0,(char *)0x0,0x3c79f8);
                plVar8 = plVar7 + 2;
                if ((long *)*plVar7 == plVar8) {
                  local_90 = *plVar8;
                  lStack_88 = plVar7[3];
                  local_a0 = &local_90;
                }
                else {
                  local_90 = *plVar8;
                  local_a0 = (long *)*plVar7;
                }
                local_98 = plVar7[1];
                *plVar7 = (long)plVar8;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                plVar7 = (long *)::std::__cxx11::string::append((char *)&local_a0);
                plVar8 = plVar7 + 2;
                if ((long *)*plVar7 == plVar8) {
                  local_70 = *plVar8;
                  lStack_68 = plVar7[3];
                  local_80 = &local_70;
                }
                else {
                  local_70 = *plVar8;
                  local_80 = (long *)*plVar7;
                }
                local_78 = plVar7[1];
                *plVar7 = (long)plVar8;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_80);
                if (local_80 != &local_70) {
                  operator_delete(local_80,local_70 + 1);
                }
                if (local_a0 != &local_90) {
                  operator_delete(local_a0,local_90 + 1);
                }
                if (local_50[0] != local_40) {
                  operator_delete(local_50[0],local_40[0] + 1);
                }
                bVar2 = false;
              }
            }
            else {
              uVar10 = (ulong)uVar5;
              if (uVar3 < uVar10) {
                if (err == (string *)0x0) {
                  bVar2 = false;
                }
                else {
                  bVar2 = false;
                  ::std::__cxx11::string::_M_replace
                            ((ulong)err,0,(char *)err->_M_string_length,0x3c7a87);
                }
              }
              else {
                source = (int *)((long)source + (long)compressedSize_00);
                local_58 = local_58 + uVar10;
                local_c0 = local_c0 + uVar10;
                bVar2 = true;
                local_60 = uVar3 - uVar10;
              }
            }
          }
          if (!bVar2) {
            return 0;
          }
          iVar12 = iVar12 + 1;
          uVar10 = uVar15;
          if (iVar12 == cVar1) {
            return local_c0;
          }
        } while( true );
      }
    }
    else if (err != (string *)0x0) {
      pcVar11 = (char *)err->_M_string_length;
      pcVar9 = "Corrupted LZ4 compressed data.\n";
      goto LAB_00317aa6;
    }
  }
  return 0;
}

Assistant:

size_t LZ4Compression::DecompressFromBuffer(char const *compressedPtr,
                                               char *outputPtr,
                                               size_t compressedSize,
                                               size_t maxOutputSize,
                                               std::string *err) {
  if (compressedSize <= 1) {
      if (err) {
        (*err) =
            "Invalid compressedSize.\n";
      }
    return 0;
  }

  // Check first byte for # chunks.
  int nChunks = *compressedPtr++;
  if (nChunks > 127) {
    if (err) {
      (*err) =
          "Too many chunks in LZ4 compressed data.\n";
    }
    return 0;
  }

  DCOUT("compressedSize = " << compressedSize);
  DCOUT("maxOutputSize = " << maxOutputSize);
  DCOUT("nChunks = " << nChunks);
  //std::cout << "compressedSize = " << compressedSize << "\n";
  //std::cout << "maxOutputSize = " << maxOutputSize << "\n";
  //std::cout << "nChunks = " << nChunks << "\n";

  size_t consumedCompressedSize = 1;

  if (maxOutputSize < LZ4_MAX_INPUT_SIZE) {
    // nChunks must be 0 for < LZ4_MAX_INPUT_SIZE
    if (nChunks != 0) {
      if (err) {
        (*err) = "Corrupted LZ4 compressed data.\n";
      }
      return 0;
    }
  }

  if (nChunks == 0) {
    // Just one.
    int nDecompressed = LZ4_decompress_safe(compressedPtr, outputPtr,
                                            int(compressedSize - 1), int(maxOutputSize));
    if (nDecompressed < 0) {
      if (err) {
        (*err) =
            "Failed to decompress data, possibly corrupt? "
            "LZ4 error code: " +
            std::to_string(nDecompressed) + "\n";
      }
      return 0;
    }
    return size_t(nDecompressed);
  } else {
    // Do each chunk.
    size_t totalDecompressed = 0;
    for (int i = 0; i < nChunks; ++i) {
      int32_t chunkSize = 0;
      if (consumedCompressedSize + sizeof(chunkSize) > compressedSize) {
        if (err) {
           (*err) += "Corrupted chunk data.";
        }
        return 0;
          
      }

      memcpy(&chunkSize, compressedPtr, sizeof(chunkSize));

      if (chunkSize > LZ4_MAX_INPUT_SIZE) {
        if (err) {
           (*err) += "ChunkSize exceeds LZ4_MAX_INPUT_SIZE.\n";
        }
        return 0;
      }
      if (chunkSize <= 0) {
        if (err) {
           (*err) += "Invalid ChunkSize.\n";
        }
        return 0;
      }

      DCOUT("chunk[" << i << "] size = " << chunkSize);

      //std::cout << "chunkSize = " << chunkSize << "\n";
      consumedCompressedSize += sizeof(chunkSize);
      //std::cout << "consumedCompressedSize = " << consumedCompressedSize << "\n";
      //std::cout << "compressedSize = " << compressedSize << "\n";
      if (consumedCompressedSize > compressedSize) {
        if (err) {
           (*err) += "Total chunk size exceeds input compressedSize.\n";
        }
        return 0;
      }

      compressedPtr += sizeof(chunkSize);
      int nDecompressed = LZ4_decompress_safe(
          compressedPtr, outputPtr, chunkSize,
          int(std::min<size_t>(LZ4_MAX_INPUT_SIZE, maxOutputSize)));
      if (nDecompressed <= 0) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt? "
              "LZ4 error code: " +
              std::to_string(nDecompressed) + "\n";
        }
        return 0;
      }
      //std::cout << "nDecompressed = " << nDecompressed << "\n";
      if (nDecompressed > maxOutputSize) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt?\n";
        }
        return 0;
      }
      compressedPtr += chunkSize;
      outputPtr += nDecompressed;
      maxOutputSize -= size_t(nDecompressed);
      totalDecompressed += size_t(nDecompressed);
    }
    return totalDecompressed;
  }
  // unreachable.
}